

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

bool __thiscall ON_SubDHeap::ReturnFaceExtraArray(ON_SubDHeap *this,ON_SubDFace *f)

{
  if (f == (ON_SubDFace *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  else {
    if (f->m_edgex != (ON_SubDEdgePtr *)0x0 || f->m_edgex_capacity != 0) {
      ReturnArray(this,(ulong)f->m_edgex_capacity,&f->m_edgex->m_ptr);
      f->m_edgex = (ON_SubDEdgePtr *)0x0;
      f->m_edgex_capacity = 0;
    }
    if (4 < f->m_edge_count) {
      f->m_edge_count = 4;
    }
  }
  return f != (ON_SubDFace *)0x0;
}

Assistant:

bool ON_SubDHeap::ReturnFaceExtraArray(
  ON_SubDFace* f
  )
{
  if ( nullptr == f )
    return ON_SUBD_RETURN_ERROR(false);
  if (nullptr != f->m_edgex || f->m_edgex_capacity > 0)
  {
    ReturnArray(f->m_edgex_capacity,(ON__UINT_PTR*)f->m_edgex);
    f->m_edgex = nullptr;
    f->m_edgex_capacity = 0;
  }
  if (f->m_edge_count > 4)
    f->m_edge_count = 4;
  return true;
}